

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O0

bool __thiscall tl::StrT<char>::operator==(StrT<char> *this,CStrT<char> o)

{
  u32 uVar1;
  char cVar2;
  u32 uVar3;
  uint local_2c;
  uint32_t i;
  StrT<char> *this_local;
  CStrT<char> o_local;
  
  o_local._0_8_ = o._str;
  this_local._0_4_ = o._size;
  uVar1 = this->_size;
  uVar3 = CStrT<char>::size((CStrT<char> *)&this_local);
  if (uVar1 == uVar3) {
    for (local_2c = 0; local_2c < this->_size; local_2c = local_2c + 1) {
      cVar2 = CStrT<char>::operator[]((CStrT<char> *)&this_local,local_2c);
      if (cVar2 != this->_str[local_2c]) {
        return false;
      }
    }
    o_local._str._7_1_ = true;
  }
  else {
    o_local._str._7_1_ = false;
  }
  return o_local._str._7_1_;
}

Assistant:

bool StrT<CharT>::operator==(CStrT<CharT> o)const
{
    if(_size != o.size())
        return false;
    for(uint32_t i = 0; i < _size; i++) {
        if(o[i] != _str[i])
            return false;
    }
    return true;
}